

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui.cpp
# Opt level: O1

void __thiscall CUI::ClipEnable(CUI *this,CUIRect *pRect)

{
  CUIRect *pCVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  ulong uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  uint uVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  
  if (this->m_NumClips == 0) {
    fVar9 = pRect->y;
    fVar10 = pRect->w;
    fVar11 = pRect->h;
    this->m_aClips[0].x = pRect->x;
    this->m_aClips[0].y = fVar9;
    this->m_aClips[0].w = fVar10;
    this->m_aClips[0].h = fVar11;
  }
  else {
    dbg_assert_imp("/workspace/llm4binary/github/license_all_cmakelists_1510/TsFreddie[P]teeworlds/src/game/client/ui.cpp"
                   ,0xb0,(uint)(this->m_NumClips < 0x10),"max clip nesting depth exceeded");
    dbg_assert_imp("/workspace/llm4binary/github/license_all_cmakelists_1510/TsFreddie[P]teeworlds/src/game/client/ui.cpp"
                   ,0xca,(uint)(this->m_NumClips != 0),"no clip region");
    uVar12 = this->m_NumClips - 1;
    uVar5._0_4_ = pRect->x;
    uVar5._4_4_ = pRect->y;
    auVar13._8_8_ = 0;
    auVar13._0_8_ = uVar5;
    uVar2 = pRect->w;
    uVar6 = pRect->h;
    auVar15._0_4_ = (float)uVar2 + (float)(undefined4)uVar5;
    auVar15._4_4_ = (float)uVar6 + (float)uVar5._4_4_;
    auVar15._8_8_ = 0;
    uVar3 = this->m_aClips[uVar12].x;
    uVar7 = this->m_aClips[uVar12].y;
    auVar14._4_4_ = uVar7;
    auVar14._0_4_ = uVar3;
    uVar4 = this->m_aClips[uVar12].w;
    uVar8 = this->m_aClips[uVar12].h;
    auVar16._4_4_ = (float)uVar8 + (float)uVar7;
    auVar16._0_4_ = (float)uVar4 + (float)uVar3;
    auVar16._8_8_ = 0;
    auVar16 = minps(auVar15,auVar16);
    auVar14._8_8_ = 0;
    auVar14 = maxps(auVar13,auVar14);
    pCVar1 = this->m_aClips + this->m_NumClips;
    pCVar1->x = (float)(int)auVar14._0_8_;
    pCVar1->y = (float)(int)((ulong)auVar14._0_8_ >> 0x20);
    pCVar1->w = auVar16._0_4_ - (float)(undefined4)uVar5;
    pCVar1->h = auVar16._4_4_ - (float)uVar5._4_4_;
  }
  this->m_NumClips = this->m_NumClips + 1;
  UpdateClipping(this);
  return;
}

Assistant:

void CUI::ClipEnable(const CUIRect *pRect)
{
	if(IsClipped())
	{
		dbg_assert(m_NumClips < MAX_CLIP_NESTING_DEPTH, "max clip nesting depth exceeded");
		const CUIRect *pOldRect = ClipArea();
		CUIRect Intersection;
		Intersection.x = maximum(pRect->x, pOldRect->x);
		Intersection.y = maximum(pRect->y, pOldRect->y);
		Intersection.w = minimum(pRect->x+pRect->w, pOldRect->x+pOldRect->w) - pRect->x;
		Intersection.h = minimum(pRect->y+pRect->h, pOldRect->y+pOldRect->h) - pRect->y;
		m_aClips[m_NumClips] = Intersection;
	}
	else
	{
		m_aClips[m_NumClips] = *pRect;
	}
	m_NumClips++;
	UpdateClipping();
}